

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_type.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,node_type id)

{
  int iVar1;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25;
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  
  if (operator<<(std::ostream&,node_type)::name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,node_type)::name_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&operator<<(std::ostream&,node_type)::name_abi_cxx11_,"D",&local_21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 1),"P0",
                 &local_22);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 2),"I1",
                 &local_23);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 3),"P1",
                 &local_24);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 4),"I2",
                 &local_25);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 5),"P2",
                 &local_26);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 6),"I3",
                 &local_27);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 7),"P3",
                 &local_28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 8),"I4",
                 &local_29);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 9),"P4",
                 &local_2a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 10),"P5"
                 ,&local_2b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 0xb),
                 "P6",&local_2c);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(operator<<(std::ostream&,node_type)::name_abi_cxx11_._M_elems + 0xc),
                 "P7",&local_2d);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_13UL>
                   ::~array,&operator<<(std::ostream&,node_type)::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,node_type)::name_abi_cxx11_);
    }
  }
  std::operator<<(stream,(string *)
                         (&boost::asio::detail::
                           execution_context_service_base<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>>
                           ::id + (ulong)id * 0x20));
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, node_type id)
{
    static const std::array<std::string, 13> name = { "D", "P0", "I1", "P1", "I2", "P2", "I3", "P3", "I4", "P4", "P5", "P6", "P7"};
    stream << name[id - 1];
    return stream;
}